

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void mp::internal::PrintSolution
               (double *values,int num_values,char *name_col,char *value_col,NameProvider *np)

{
  double dVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  StringRef SVar5;
  long local_68 [2];
  StringRef local_58;
  char *local_48;
  
  if (num_values != 0 && values != (double *)0x0) {
    sVar3 = strlen(name_col);
    if (0 < num_values) {
      sVar4 = 0;
      do {
        SVar5 = NameProvider::name(np,sVar4,0xffffffffffffffff);
        uVar2 = SVar5.size_;
        if (SVar5.size_ < sVar3) {
          uVar2 = sVar3;
        }
        sVar3 = uVar2;
        sVar4 = sVar4 + 1;
      } while ((uint)num_values != sVar4);
    }
    local_58.data_ = name_col;
    local_68[0] = sVar3 + 2;
    local_48 = value_col;
    fmt::fprintf(_stdout,"\n%-*s%s\n",0xaa5);
    if (0 < num_values) {
      sVar4 = 0;
      do {
        dVar1 = values[sVar4];
        local_58 = NameProvider::name(np,sVar4,0xffffffffffffffff);
        local_48 = (char *)(~-(ulong)(dVar1 == 0.0) & (ulong)dVar1);
        local_68[0] = sVar3 + 2;
        fmt::fprintf(_stdout,"%-*s%.17g\n",0x8b5,local_68);
        sVar4 = sVar4 + 1;
      } while ((uint)num_values != sVar4);
    }
  }
  return;
}

Assistant:

void PrintSolution(const double *values, int num_values, const char *name_col,
                   const char *value_col, NameProvider &np) {
  if (!values || num_values == 0)
    return;
  std::size_t name_len = std::strlen(name_col);
  std::size_t name_field_width = name_len;
  for (int i = 0; i < num_values; ++i)
    name_field_width = std::max(name_field_width, np.name(i).size());
  name_field_width += 2;
  fmt::printf("\n%-*s%s\n", name_field_width, name_col, value_col);
  for (int i = 0; i < num_values; ++i) {
    double value = values[i];
    fmt::printf("%-*s%.17g\n", name_field_width, np.name(i), value ? value : 0);
  }
}